

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

void __thiscall
vkt::ssbo::SSBOLayoutCase::SSBOLayoutCase
          (SSBOLayoutCase *this,TestContext *testCtx,char *name,char *description,
          BufferMode bufferMode,MatrixLoadFlags matrixLoadFlag)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,name,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,description,&local_6a);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_48[0],(char *)local_68[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1aed0;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00d2a318;
  this->m_bufferMode = bufferMode;
  (this->m_interface).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_interface).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_interface).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_interface).m_bufferBlocks.
  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_interface).m_bufferBlocks.
  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_interface).m_bufferBlocks.
  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_matrixLoadFlag = matrixLoadFlag;
  memset(&this->m_refLayout,0,0x90);
  (this->m_computeShaderSrc)._M_dataplus._M_p = (pointer)&(this->m_computeShaderSrc).field_2;
  (this->m_computeShaderSrc)._M_string_length = 0;
  (this->m_computeShaderSrc).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SSBOLayoutCase::SSBOLayoutCase (tcu::TestContext& testCtx, const char* name, const char* description, BufferMode bufferMode, MatrixLoadFlags matrixLoadFlag)
	: TestCase			(testCtx, name, description)
	, m_bufferMode		(bufferMode)
	, m_matrixLoadFlag	(matrixLoadFlag)
{
}